

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsGetNullValue(JsValueRef *nullValue)

{
  ScriptContext *pSVar1;
  JsrtContext *pJVar2;
  JsErrorCode JVar3;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  pJVar2 = JsrtContext::GetCurrent();
  if (pJVar2 == (JsrtContext *)0x0) {
    JVar3 = JsErrorNoCurrentContext;
  }
  else {
    pSVar1 = (((pJVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (nullValue == (JsValueRef *)0x0) {
      JVar3 = JsErrorNullArgument;
    }
    else {
      *nullValue = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).nullValue.ptr;
      JVar3 = JsNoError;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsGetNullValue(_Out_ JsValueRef *nullValue)
{
    return ContextAPINoScriptWrapper_NoRecord([&] (Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(nullValue);

        *nullValue = scriptContext->GetLibrary()->GetNull();

        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}